

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_pathmatch.c
# Opt level: O2

void test_archive_pathmatch(void)

{
  wchar_t wVar1;
  
  wVar1 = __archive_pathmatch("a/b/c","a/b/c",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'0',1,"1",(long)wVar1,"archive_pathmatch(\"a/b/c\", \"a/b/c\", 0)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("a/b/","a/b/c",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'1',0,"0",(long)wVar1,"archive_pathmatch(\"a/b/\", \"a/b/c\", 0)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("a/b","a/b/c",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'2',0,"0",(long)wVar1,"archive_pathmatch(\"a/b\", \"a/b/c\", 0)",(void *)0x0
                     );
  wVar1 = __archive_pathmatch("a/b/c","a/b/",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'3',0,"0",(long)wVar1,"archive_pathmatch(\"a/b/c\", \"a/b/\", 0)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("a/b/c","a/b",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'4',0,"0",(long)wVar1,"archive_pathmatch(\"a/b/c\", \"a/b\", 0)",(void *)0x0
                     );
  wVar1 = __archive_pathmatch("a/b/c",(char *)0x0,L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'7',0,"0",(long)wVar1,"archive_pathmatch(\"a/b/c\", NULL, 0)",(void *)0x0);
  wVar1 = __archive_pathmatch_w(anon_var_dwarf_17b0e,(wchar_t *)0x0,L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'8',0,"0",(long)wVar1,"archive_pathmatch_w(L\"a/b/c\", NULL, 0)",(void *)0x0
                     );
  wVar1 = __archive_pathmatch("","",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L';',1,"1",(long)wVar1,"archive_pathmatch(\"\",\"\", 0)",(void *)0x0);
  wVar1 = __archive_pathmatch("","a",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'<',0,"0",(long)wVar1,"archive_pathmatch(\"\",\"a\", 0)",(void *)0x0);
  wVar1 = __archive_pathmatch("*","",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'=',1,"1",(long)wVar1,"archive_pathmatch(\"*\",\"\", 0)",(void *)0x0);
  wVar1 = __archive_pathmatch("*","a",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'>',1,"1",(long)wVar1,"archive_pathmatch(\"*\",\"a\", 0)",(void *)0x0);
  wVar1 = __archive_pathmatch("*","abcd",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'?',1,"1",(long)wVar1,"archive_pathmatch(\"*\",\"abcd\", 0)",(void *)0x0);
  wVar1 = __archive_pathmatch("*","abcd/efgh/ijkl",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'A',1,"1",(long)wVar1,"archive_pathmatch(\"*\",\"abcd/efgh/ijkl\", 0)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("abcd*efgh/ijkl","abcd/efgh/ijkl",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'B',1,"1",(long)wVar1,
                      "archive_pathmatch(\"abcd*efgh/ijkl\",\"abcd/efgh/ijkl\", 0)",(void *)0x0);
  wVar1 = __archive_pathmatch("abcd***efgh/ijkl","abcd/efgh/ijkl",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'C',1,"1",(long)wVar1,
                      "archive_pathmatch(\"abcd***efgh/ijkl\",\"abcd/efgh/ijkl\", 0)",(void *)0x0);
  wVar1 = __archive_pathmatch("abcd***/efgh/ijkl","abcd/efgh/ijkl",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'D',1,"1",(long)wVar1,
                      "archive_pathmatch(\"abcd***/efgh/ijkl\",\"abcd/efgh/ijkl\", 0)",(void *)0x0);
  wVar1 = __archive_pathmatch("?","",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'E',0,"0",(long)wVar1,"archive_pathmatch(\"?\", \"\", 0)",(void *)0x0);
  wVar1 = __archive_pathmatch("?","",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'F',0,"0",(long)wVar1,"archive_pathmatch(\"?\", \"\\0\", 0)",(void *)0x0);
  wVar1 = __archive_pathmatch("?","a",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'G',1,"1",(long)wVar1,"archive_pathmatch(\"?\", \"a\", 0)",(void *)0x0);
  wVar1 = __archive_pathmatch("?","ab",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'H',0,"0",(long)wVar1,"archive_pathmatch(\"?\", \"ab\", 0)",(void *)0x0);
  wVar1 = __archive_pathmatch("?",".",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'I',1,"1",(long)wVar1,"archive_pathmatch(\"?\", \".\", 0)",(void *)0x0);
  wVar1 = __archive_pathmatch("?","?",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'J',1,"1",(long)wVar1,"archive_pathmatch(\"?\", \"?\", 0)",(void *)0x0);
  wVar1 = __archive_pathmatch("a","a",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'K',1,"1",(long)wVar1,"archive_pathmatch(\"a\", \"a\", 0)",(void *)0x0);
  wVar1 = __archive_pathmatch("a","ab",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'L',0,"0",(long)wVar1,"archive_pathmatch(\"a\", \"ab\", 0)",(void *)0x0);
  wVar1 = __archive_pathmatch("a","ab",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'M',0,"0",(long)wVar1,"archive_pathmatch(\"a\", \"ab\", 0)",(void *)0x0);
  wVar1 = __archive_pathmatch("a?c","abc",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'N',1,"1",(long)wVar1,"archive_pathmatch(\"a?c\", \"abc\", 0)",(void *)0x0);
  wVar1 = __archive_pathmatch("a?c","a/c",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'P',1,"1",(long)wVar1,"archive_pathmatch(\"a?c\", \"a/c\", 0)",(void *)0x0);
  wVar1 = __archive_pathmatch("a?*c*","a/c",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'Q',1,"1",(long)wVar1,"archive_pathmatch(\"a?*c*\", \"a/c\", 0)",(void *)0x0
                     );
  wVar1 = __archive_pathmatch("*a*","a/c",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'R',1,"1",(long)wVar1,"archive_pathmatch(\"*a*\", \"a/c\", 0)",(void *)0x0);
  wVar1 = __archive_pathmatch("*a*","/a/c",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'S',1,"1",(long)wVar1,"archive_pathmatch(\"*a*\", \"/a/c\", 0)",(void *)0x0)
  ;
  wVar1 = __archive_pathmatch("*a*","defaaaaaaa",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'T',1,"1",(long)wVar1,"archive_pathmatch(\"*a*\", \"defaaaaaaa\", 0)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("a*","defghi",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'U',0,"0",(long)wVar1,"archive_pathmatch(\"a*\", \"defghi\", 0)",(void *)0x0
                     );
  wVar1 = __archive_pathmatch("*a*","defghi",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'V',0,"0",(long)wVar1,"archive_pathmatch(\"*a*\", \"defghi\", 0)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("abc[def","abc[def",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'Y',1,"1",(long)wVar1,"archive_pathmatch(\"abc[def\", \"abc[def\", 0)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("abc[def]","abc[def",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'Z',0,"0",(long)wVar1,"archive_pathmatch(\"abc[def]\", \"abc[def\", 0)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("abc[def","abcd",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'[',0,"0",(long)wVar1,"archive_pathmatch(\"abc[def\", \"abcd\", 0)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("abc[def]","abcd",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'\\',1,"1",(long)wVar1,"archive_pathmatch(\"abc[def]\", \"abcd\", 0)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("abc[def]","abce",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L']',1,"1",(long)wVar1,"archive_pathmatch(\"abc[def]\", \"abce\", 0)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("abc[def]","abcf",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'^',1,"1",(long)wVar1,"archive_pathmatch(\"abc[def]\", \"abcf\", 0)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("abc[def]","abcg",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'_',0,"0",(long)wVar1,"archive_pathmatch(\"abc[def]\", \"abcg\", 0)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("abc[d*f]","abcd",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'`',1,"1",(long)wVar1,"archive_pathmatch(\"abc[d*f]\", \"abcd\", 0)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("abc[d*f]","abc*",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'a',1,"1",(long)wVar1,"archive_pathmatch(\"abc[d*f]\", \"abc*\", 0)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("abc[d*f]","abcdefghi",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'b',0,"0",(long)wVar1,"archive_pathmatch(\"abc[d*f]\", \"abcdefghi\", 0)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("abc[d*","abcdefghi",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'c',0,"0",(long)wVar1,"archive_pathmatch(\"abc[d*\", \"abcdefghi\", 0)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("abc[d*","abc[defghi",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'd',1,"1",(long)wVar1,"archive_pathmatch(\"abc[d*\", \"abc[defghi\", 0)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("abc[d-f]","abcd",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'e',1,"1",(long)wVar1,"archive_pathmatch(\"abc[d-f]\", \"abcd\", 0)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("abc[d-f]","abce",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'f',1,"1",(long)wVar1,"archive_pathmatch(\"abc[d-f]\", \"abce\", 0)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("abc[d-f]","abcf",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'g',1,"1",(long)wVar1,"archive_pathmatch(\"abc[d-f]\", \"abcf\", 0)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("abc[d-f]","abcg",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'h',0,"0",(long)wVar1,"archive_pathmatch(\"abc[d-f]\", \"abcg\", 0)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("abc[d-fh-k]","abca",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'i',0,"0",(long)wVar1,"archive_pathmatch(\"abc[d-fh-k]\", \"abca\", 0)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("abc[d-fh-k]","abcd",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'j',1,"1",(long)wVar1,"archive_pathmatch(\"abc[d-fh-k]\", \"abcd\", 0)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("abc[d-fh-k]","abce",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'k',1,"1",(long)wVar1,"archive_pathmatch(\"abc[d-fh-k]\", \"abce\", 0)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("abc[d-fh-k]","abcf",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'l',1,"1",(long)wVar1,"archive_pathmatch(\"abc[d-fh-k]\", \"abcf\", 0)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("abc[d-fh-k]","abcg",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'm',0,"0",(long)wVar1,"archive_pathmatch(\"abc[d-fh-k]\", \"abcg\", 0)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("abc[d-fh-k]","abch",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'n',1,"1",(long)wVar1,"archive_pathmatch(\"abc[d-fh-k]\", \"abch\", 0)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("abc[d-fh-k]","abci",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'o',1,"1",(long)wVar1,"archive_pathmatch(\"abc[d-fh-k]\", \"abci\", 0)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("abc[d-fh-k]","abcj",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'p',1,"1",(long)wVar1,"archive_pathmatch(\"abc[d-fh-k]\", \"abcj\", 0)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("abc[d-fh-k]","abck",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'q',1,"1",(long)wVar1,"archive_pathmatch(\"abc[d-fh-k]\", \"abck\", 0)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("abc[d-fh-k]","abcl",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'r',0,"0",(long)wVar1,"archive_pathmatch(\"abc[d-fh-k]\", \"abcl\", 0)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("abc[d-fh-k]","abc-",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L's',0,"0",(long)wVar1,"archive_pathmatch(\"abc[d-fh-k]\", \"abc-\", 0)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("abc[]efg","abcdefg",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'v',0,"0",(long)wVar1,"archive_pathmatch(\"abc[]efg\", \"abcdefg\", 0)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("abc[]efg","abcqefg",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'w',0,"0",(long)wVar1,"archive_pathmatch(\"abc[]efg\", \"abcqefg\", 0)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("abc[]efg","abcefg",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'x',0,"0",(long)wVar1,"archive_pathmatch(\"abc[]efg\", \"abcefg\", 0)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("abc[!]efg","abcdefg",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'y',1,"1",(long)wVar1,"archive_pathmatch(\"abc[!]efg\", \"abcdefg\", 0)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("abc[!]efg","abcqefg",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'z',1,"1",(long)wVar1,"archive_pathmatch(\"abc[!]efg\", \"abcqefg\", 0)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("abc[!]efg","abcefg",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'{',0,"0",(long)wVar1,"archive_pathmatch(\"abc[!]efg\", \"abcefg\", 0)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("abc[d-fh-]","abcl",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'~',0,"0",(long)wVar1,"archive_pathmatch(\"abc[d-fh-]\", \"abcl\", 0)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("abc[d-fh-]","abch",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'\x7f',1,"1",(long)wVar1,"archive_pathmatch(\"abc[d-fh-]\", \"abch\", 0)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("abc[d-fh-]","abc-",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'\x80',1,"1",(long)wVar1,"archive_pathmatch(\"abc[d-fh-]\", \"abc-\", 0)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("abc[d-fh-]","abc-",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'\x81',1,"1",(long)wVar1,"archive_pathmatch(\"abc[d-fh-]\", \"abc-\", 0)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("abc[\\]]","abc]",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'\x84',1,"1",(long)wVar1,"archive_pathmatch(\"abc[\\\\]]\", \"abc]\", 0)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("abc[\\]d]","abc]",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'\x85',1,"1",(long)wVar1,"archive_pathmatch(\"abc[\\\\]d]\", \"abc]\", 0)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("abc[\\]d]","abcd",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'\x86',1,"1",(long)wVar1,"archive_pathmatch(\"abc[\\\\]d]\", \"abcd\", 0)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("abc[d\\]]","abc]",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'\x87',1,"1",(long)wVar1,"archive_pathmatch(\"abc[d\\\\]]\", \"abc]\", 0)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("abc[d\\]]","abcd",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'\x88',1,"1",(long)wVar1,"archive_pathmatch(\"abc[d\\\\]]\", \"abcd\", 0)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("abc[d]e]","abcde]",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'\x89',1,"1",(long)wVar1,"archive_pathmatch(\"abc[d]e]\", \"abcde]\", 0)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("abc[d\\]e]","abc]",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'\x8a',1,"1",(long)wVar1,"archive_pathmatch(\"abc[d\\\\]e]\", \"abc]\", 0)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("abc[d\\]e]","abcd]e",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'\x8b',0,"0",(long)wVar1,
                      "archive_pathmatch(\"abc[d\\\\]e]\", \"abcd]e\", 0)",(void *)0x0);
  wVar1 = __archive_pathmatch("abc[d]e]","abc]",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'\x8c',0,"0",(long)wVar1,"archive_pathmatch(\"abc[d]e]\", \"abc]\", 0)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("abc[\\d-f]gh","abcegh",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'\x8f',1,"1",(long)wVar1,
                      "archive_pathmatch(\"abc[\\\\d-f]gh\", \"abcegh\", 0)",(void *)0x0);
  wVar1 = __archive_pathmatch("abc[\\d-f]gh","abcggh",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'\x90',0,"0",(long)wVar1,
                      "archive_pathmatch(\"abc[\\\\d-f]gh\", \"abcggh\", 0)",(void *)0x0);
  wVar1 = __archive_pathmatch("abc[\\d-f]gh","abc\\gh",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'\x91',0,"0",(long)wVar1,
                      "archive_pathmatch(\"abc[\\\\d-f]gh\", \"abc\\\\gh\", 0)",(void *)0x0);
  wVar1 = __archive_pathmatch("abc[d-\\f]gh","abcegh",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'\x92',1,"1",(long)wVar1,
                      "archive_pathmatch(\"abc[d-\\\\f]gh\", \"abcegh\", 0)",(void *)0x0);
  wVar1 = __archive_pathmatch("abc[\\d-\\f]gh","abcegh",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'\x93',1,"1",(long)wVar1,
                      "archive_pathmatch(\"abc[\\\\d-\\\\f]gh\", \"abcegh\", 0)",(void *)0x0);
  wVar1 = __archive_pathmatch("abc[\\d-\\f]gh","abcegh",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'\x94',1,"1",(long)wVar1,
                      "archive_pathmatch(\"abc[\\\\d-\\\\f]gh\", \"abcegh\", 0)",(void *)0x0);
  wVar1 = __archive_pathmatch("abc[d\\-f]gh","abcegh",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'\x96',0,"0",(long)wVar1,
                      "archive_pathmatch(\"abc[d\\\\-f]gh\", \"abcegh\", 0)",(void *)0x0);
  wVar1 = __archive_pathmatch("abc[d\\-f]gh","abc-gh",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'\x97',1,"1",(long)wVar1,
                      "archive_pathmatch(\"abc[d\\\\-f]gh\", \"abc-gh\", 0)",(void *)0x0);
  wVar1 = __archive_pathmatch("abc[!d]","abcd",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'\x9a',0,"0",(long)wVar1,"archive_pathmatch(\"abc[!d]\", \"abcd\", 0)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("abc[!d]","abce",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'\x9b',1,"1",(long)wVar1,"archive_pathmatch(\"abc[!d]\", \"abce\", 0)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("abc[!d]","abcc",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'\x9c',1,"1",(long)wVar1,"archive_pathmatch(\"abc[!d]\", \"abcc\", 0)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("abc[!d-z]","abcq",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'\x9d',0,"0",(long)wVar1,"archive_pathmatch(\"abc[!d-z]\", \"abcq\", 0)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("abc[!d-gi-z]","abch",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'\x9e',1,"1",(long)wVar1,"archive_pathmatch(\"abc[!d-gi-z]\", \"abch\", 0)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("abc[!fgijkl]","abch",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'\x9f',1,"1",(long)wVar1,"archive_pathmatch(\"abc[!fgijkl]\", \"abch\", 0)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("abc[!fghijkl]","abch",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'\xa0',0,"0",(long)wVar1,"archive_pathmatch(\"abc[!fghijkl]\", \"abch\", 0)"
                      ,(void *)0x0);
  wVar1 = __archive_pathmatch("abc\\[def]","abc\\d",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'£',0,"0",(long)wVar1,
                      "archive_pathmatch(\"abc\\\\[def]\", \"abc\\\\d\", 0)",(void *)0x0);
  wVar1 = __archive_pathmatch("abc\\[def]","abc[def]",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'¤',1,"1",(long)wVar1,
                      "archive_pathmatch(\"abc\\\\[def]\", \"abc[def]\", 0)",(void *)0x0);
  wVar1 = __archive_pathmatch("abc\\\\[def]","abc[def]",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'¥',0,"0",(long)wVar1,
                      "archive_pathmatch(\"abc\\\\\\\\[def]\", \"abc[def]\", 0)",(void *)0x0);
  wVar1 = __archive_pathmatch("abc\\\\[def]","abc\\[def]",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'¦',0,"0",(long)wVar1,
                      "archive_pathmatch(\"abc\\\\\\\\[def]\", \"abc\\\\[def]\", 0)",(void *)0x0);
  wVar1 = __archive_pathmatch("abc\\\\[def]","abc\\d",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'§',1,"1",(long)wVar1,
                      "archive_pathmatch(\"abc\\\\\\\\[def]\", \"abc\\\\d\", 0)",(void *)0x0);
  wVar1 = __archive_pathmatch("abcd\\","abcd\\",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'¨',1,"1",(long)wVar1,"archive_pathmatch(\"abcd\\\\\", \"abcd\\\\\", 0)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("abcd\\","abcd\\[",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'©',0,"0",(long)wVar1,"archive_pathmatch(\"abcd\\\\\", \"abcd\\\\[\", 0)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("abcd\\","abcde",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'ª',0,"0",(long)wVar1,"archive_pathmatch(\"abcd\\\\\", \"abcde\", 0)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("abcd\\[","abcd\\",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'«',0,"0",(long)wVar1,"archive_pathmatch(\"abcd\\\\[\", \"abcd\\\\\", 0)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("a/b/","a/bc",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'³',0,"0",(long)wVar1,"archive_pathmatch(\"a/b/\", \"a/bc\", 0)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("a/./b","a/b",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'´',1,"1",(long)wVar1,"archive_pathmatch(\"a/./b\", \"a/b\", 0)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("a\\/./b","a/b",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'µ',0,"0",(long)wVar1,"archive_pathmatch(\"a\\\\/./b\", \"a/b\", 0)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("a/\\./b","a/b",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'¶',0,"0",(long)wVar1,"archive_pathmatch(\"a/\\\\./b\", \"a/b\", 0)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("a/.\\/b","a/b",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'·',0,"0",(long)wVar1,"archive_pathmatch(\"a/.\\\\/b\", \"a/b\", 0)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("a\\/\\.\\/b","a/b",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'¸',0,"0",(long)wVar1,
                      "archive_pathmatch(\"a\\\\/\\\\.\\\\/b\", \"a/b\", 0)",(void *)0x0);
  wVar1 = __archive_pathmatch("./abc/./def/","abc/def/",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'¹',1,"1",(long)wVar1,
                      "archive_pathmatch(\"./abc/./def/\", \"abc/def/\", 0)",(void *)0x0);
  wVar1 = __archive_pathmatch("abc/def","./././abc/./def",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'º',1,"1",(long)wVar1,
                      "archive_pathmatch(\"abc/def\", \"./././abc/./def\", 0)",(void *)0x0);
  wVar1 = __archive_pathmatch("abc/def/././//","./././abc/./def/",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'»',1,"1",(long)wVar1,
                      "archive_pathmatch(\"abc/def/././//\", \"./././abc/./def/\", 0)",(void *)0x0);
  wVar1 = __archive_pathmatch(".////abc/.//def","./././abc/./def",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'¼',1,"1",(long)wVar1,
                      "archive_pathmatch(\".////abc/.//def\", \"./././abc/./def\", 0)",(void *)0x0);
  wVar1 = __archive_pathmatch("./abc?def/","abc/def/",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'½',1,"1",(long)wVar1,"archive_pathmatch(\"./abc?def/\", \"abc/def/\", 0)",
                      (void *)0x0);
  failure("\"?./\" is not the same as \"/./\"");
  wVar1 = __archive_pathmatch("./abc?./def/","abc/def/",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'¿',0,"0",(long)wVar1,
                      "archive_pathmatch(\"./abc?./def/\", \"abc/def/\", 0)",(void *)0x0);
  failure("Trailing \'/\' should match no trailing \'/\'");
  wVar1 = __archive_pathmatch("./abc/./def/","abc/def",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'Á',1,"1",(long)wVar1,"archive_pathmatch(\"./abc/./def/\", \"abc/def\", 0)"
                      ,(void *)0x0);
  failure("Trailing \'/./\' is still the same directory.");
  wVar1 = __archive_pathmatch("./abc/./def/./","abc/def",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'Ã',1,"1",(long)wVar1,
                      "archive_pathmatch(\"./abc/./def/./\", \"abc/def\", 0)",(void *)0x0);
  failure("Trailing \'/.\' is still the same directory.");
  wVar1 = __archive_pathmatch("./abc/./def/.","abc/def",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'Å',1,"1",(long)wVar1,
                      "archive_pathmatch(\"./abc/./def/.\", \"abc/def\", 0)",(void *)0x0);
  wVar1 = __archive_pathmatch("./abc/./def","abc/def/",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'Æ',1,"1",(long)wVar1,"archive_pathmatch(\"./abc/./def\", \"abc/def/\", 0)"
                      ,(void *)0x0);
  failure("Trailing \'/./\' is still the same directory.");
  wVar1 = __archive_pathmatch("./abc/./def","abc/def/./",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'È',1,"1",(long)wVar1,
                      "archive_pathmatch(\"./abc/./def\", \"abc/def/./\", 0)",(void *)0x0);
  failure("Trailing \'/.\' is still the same directory.");
  wVar1 = __archive_pathmatch("./abc*/./def","abc/def/.",L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'Ê',1,"1",(long)wVar1,
                      "archive_pathmatch(\"./abc*/./def\", \"abc/def/.\", 0)",(void *)0x0);
  wVar1 = __archive_pathmatch("bcd","abcd",L'\x01');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'Î',0,"0",(long)wVar1,
                      "archive_pathmatch(\"bcd\", \"abcd\", PATHMATCH_NO_ANCHOR_START)",(void *)0x0)
  ;
  wVar1 = __archive_pathmatch("abcd","abcd",L'\x01');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'Ð',1,"1",(long)wVar1,
                      "archive_pathmatch(\"abcd\", \"abcd\", PATHMATCH_NO_ANCHOR_START)",(void *)0x0
                     );
  wVar1 = __archive_pathmatch("^bcd","abcd",L'\x01');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'Ò',0,"0",(long)wVar1,
                      "archive_pathmatch(\"^bcd\", \"abcd\", PATHMATCH_NO_ANCHOR_START)",(void *)0x0
                     );
  wVar1 = __archive_pathmatch("b/c/d","a/b/c/d",L'\x01');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'Ô',1,"1",(long)wVar1,
                      "archive_pathmatch(\"b/c/d\", \"a/b/c/d\", PATHMATCH_NO_ANCHOR_START)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("^b/c/d","a/b/c/d",L'\x01');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'Ö',0,"0",(long)wVar1,
                      "archive_pathmatch(\"^b/c/d\", \"a/b/c/d\", PATHMATCH_NO_ANCHOR_START)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("/b/c/d","a/b/c/d",L'\x01');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'Ø',0,"0",(long)wVar1,
                      "archive_pathmatch(\"/b/c/d\", \"a/b/c/d\", PATHMATCH_NO_ANCHOR_START)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("a/b/c","a/b/c/d",L'\x01');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'Ú',0,"0",(long)wVar1,
                      "archive_pathmatch(\"a/b/c\", \"a/b/c/d\", PATHMATCH_NO_ANCHOR_START)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("a/b/c/d","a/b/c/d",L'\x01');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'Ü',1,"1",(long)wVar1,
                      "archive_pathmatch(\"a/b/c/d\", \"a/b/c/d\", PATHMATCH_NO_ANCHOR_START)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("b/c","a/b/c/d",L'\x01');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'Þ',0,"0",(long)wVar1,
                      "archive_pathmatch(\"b/c\", \"a/b/c/d\", PATHMATCH_NO_ANCHOR_START)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("^b/c","a/b/c/d",L'\x01');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'à',0,"0",(long)wVar1,
                      "archive_pathmatch(\"^b/c\", \"a/b/c/d\", PATHMATCH_NO_ANCHOR_START)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("b/c/d","a/b/c/d",L'\x01');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'ä',1,"1",(long)wVar1,
                      "archive_pathmatch(\"b/c/d\", \"a/b/c/d\", PATHMATCH_NO_ANCHOR_START)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("b/c/d","/a/b/c/d",L'\x01');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'æ',1,"1",(long)wVar1,
                      "archive_pathmatch(\"b/c/d\", \"/a/b/c/d\", PATHMATCH_NO_ANCHOR_START)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("bcd","abcd",L'\x02');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'ë',0,"0",(long)wVar1,
                      "archive_pathmatch(\"bcd\", \"abcd\", PATHMATCH_NO_ANCHOR_END)",(void *)0x0);
  wVar1 = __archive_pathmatch("abcd","abcd",L'\x02');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'í',1,"1",(long)wVar1,
                      "archive_pathmatch(\"abcd\", \"abcd\", PATHMATCH_NO_ANCHOR_END)",(void *)0x0);
  wVar1 = __archive_pathmatch("abcd","abcd/",L'\x02');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'ï',1,"1",(long)wVar1,
                      "archive_pathmatch(\"abcd\", \"abcd/\", PATHMATCH_NO_ANCHOR_END)",(void *)0x0)
  ;
  wVar1 = __archive_pathmatch("abcd","abcd/.",L'\x02');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'ñ',1,"1",(long)wVar1,
                      "archive_pathmatch(\"abcd\", \"abcd/.\", PATHMATCH_NO_ANCHOR_END)",(void *)0x0
                     );
  wVar1 = __archive_pathmatch("abc","abcd",L'\x02');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'ó',0,"0",(long)wVar1,
                      "archive_pathmatch(\"abc\", \"abcd\", PATHMATCH_NO_ANCHOR_END)",(void *)0x0);
  wVar1 = __archive_pathmatch("a/b/c","a/b/c/d",L'\x02');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'õ',1,"1",(long)wVar1,
                      "archive_pathmatch(\"a/b/c\", \"a/b/c/d\", PATHMATCH_NO_ANCHOR_END)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("a/b/c$","a/b/c/d",L'\x02');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'÷',0,"0",(long)wVar1,
                      "archive_pathmatch(\"a/b/c$\", \"a/b/c/d\", PATHMATCH_NO_ANCHOR_END)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("a/b/c$","a/b/c",L'\x02');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'ù',1,"1",(long)wVar1,
                      "archive_pathmatch(\"a/b/c$\", \"a/b/c\", PATHMATCH_NO_ANCHOR_END)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("a/b/c$","a/b/c/",L'\x02');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'û',1,"1",(long)wVar1,
                      "archive_pathmatch(\"a/b/c$\", \"a/b/c/\", PATHMATCH_NO_ANCHOR_END)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("a/b/c/","a/b/c/d",L'\x02');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'ý',1,"1",(long)wVar1,
                      "archive_pathmatch(\"a/b/c/\", \"a/b/c/d\", PATHMATCH_NO_ANCHOR_END)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("a/b/c/$","a/b/c/d",L'\x02');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'ÿ',0,"0",(long)wVar1,
                      "archive_pathmatch(\"a/b/c/$\", \"a/b/c/d\", PATHMATCH_NO_ANCHOR_END)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("a/b/c/$","a/b/c/",L'\x02');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'ā',1,"1",(long)wVar1,
                      "archive_pathmatch(\"a/b/c/$\", \"a/b/c/\", PATHMATCH_NO_ANCHOR_END)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("a/b/c/$","a/b/c",L'\x02');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'ă',1,"1",(long)wVar1,
                      "archive_pathmatch(\"a/b/c/$\", \"a/b/c\", PATHMATCH_NO_ANCHOR_END)",
                      (void *)0x0);
  wVar1 = __archive_pathmatch("b/c","a/b/c/d",L'\x02');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'ą',0,"0",(long)wVar1,
                      "archive_pathmatch(\"b/c\", \"a/b/c/d\", PATHMATCH_NO_ANCHOR_END)",(void *)0x0
                     );
  wVar1 = __archive_pathmatch("b/c","a/b/c/d",L'\x03');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'ĉ',1,"1",(long)wVar1,
                      "archive_pathmatch(\"b/c\", \"a/b/c/d\", PATHMATCH_NO_ANCHOR_START | PATHMATCH_NO_ANCHOR_END)"
                      ,(void *)0x0);
  wVar1 = __archive_pathmatch("/b/c","a/b/c/d",L'\x03');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'ċ',0,"0",(long)wVar1,
                      "archive_pathmatch(\"/b/c\", \"a/b/c/d\", PATHMATCH_NO_ANCHOR_START | PATHMATCH_NO_ANCHOR_END)"
                      ,(void *)0x0);
  wVar1 = __archive_pathmatch("/a/b/c","a/b/c/d",L'\x03');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'č',0,"0",(long)wVar1,
                      "archive_pathmatch(\"/a/b/c\", \"a/b/c/d\", PATHMATCH_NO_ANCHOR_START | PATHMATCH_NO_ANCHOR_END)"
                      ,(void *)0x0);
  wVar1 = __archive_pathmatch("/a/b/c","/a/b/c/d",L'\x03');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'ď',1,"1",(long)wVar1,
                      "archive_pathmatch(\"/a/b/c\", \"/a/b/c/d\", PATHMATCH_NO_ANCHOR_START | PATHMATCH_NO_ANCHOR_END)"
                      ,(void *)0x0);
  wVar1 = __archive_pathmatch("/a/b/c$","a/b/c/d",L'\x03');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'đ',0,"0",(long)wVar1,
                      "archive_pathmatch(\"/a/b/c$\", \"a/b/c/d\", PATHMATCH_NO_ANCHOR_START | PATHMATCH_NO_ANCHOR_END)"
                      ,(void *)0x0);
  wVar1 = __archive_pathmatch("/a/b/c/d$","a/b/c/d",L'\x03');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'ē',0,"0",(long)wVar1,
                      "archive_pathmatch(\"/a/b/c/d$\", \"a/b/c/d\", PATHMATCH_NO_ANCHOR_START | PATHMATCH_NO_ANCHOR_END)"
                      ,(void *)0x0);
  wVar1 = __archive_pathmatch("/a/b/c/d$","/a/b/c/d/e",L'\x03');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'ĕ',0,"0",(long)wVar1,
                      "archive_pathmatch(\"/a/b/c/d$\", \"/a/b/c/d/e\", PATHMATCH_NO_ANCHOR_START | PATHMATCH_NO_ANCHOR_END)"
                      ,(void *)0x0);
  wVar1 = __archive_pathmatch("/a/b/c/d$","/a/b/c/d",L'\x03');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'ė',1,"1",(long)wVar1,
                      "archive_pathmatch(\"/a/b/c/d$\", \"/a/b/c/d\", PATHMATCH_NO_ANCHOR_START | PATHMATCH_NO_ANCHOR_END)"
                      ,(void *)0x0);
  wVar1 = __archive_pathmatch("^a/b/c","a/b/c/d",L'\x03');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'ę',1,"1",(long)wVar1,
                      "archive_pathmatch(\"^a/b/c\", \"a/b/c/d\", PATHMATCH_NO_ANCHOR_START | PATHMATCH_NO_ANCHOR_END)"
                      ,(void *)0x0);
  wVar1 = __archive_pathmatch("^a/b/c$","a/b/c/d",L'\x03');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'ě',0,"0",(long)wVar1,
                      "archive_pathmatch(\"^a/b/c$\", \"a/b/c/d\", PATHMATCH_NO_ANCHOR_START | PATHMATCH_NO_ANCHOR_END)"
                      ,(void *)0x0);
  wVar1 = __archive_pathmatch("a/b/c$","a/b/c/d",L'\x03');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'ĝ',0,"0",(long)wVar1,
                      "archive_pathmatch(\"a/b/c$\", \"a/b/c/d\", PATHMATCH_NO_ANCHOR_START | PATHMATCH_NO_ANCHOR_END)"
                      ,(void *)0x0);
  wVar1 = __archive_pathmatch("b/c/d$","a/b/c/d",L'\x03');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_pathmatch.c"
                      ,L'ğ',1,"1",(long)wVar1,
                      "archive_pathmatch(\"b/c/d$\", \"a/b/c/d\", PATHMATCH_NO_ANCHOR_START | PATHMATCH_NO_ANCHOR_END)"
                      ,(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_archive_pathmatch)
{
	assertEqualInt(1, archive_pathmatch("a/b/c", "a/b/c", 0));
	assertEqualInt(0, archive_pathmatch("a/b/", "a/b/c", 0));
	assertEqualInt(0, archive_pathmatch("a/b", "a/b/c", 0));
	assertEqualInt(0, archive_pathmatch("a/b/c", "a/b/", 0));
	assertEqualInt(0, archive_pathmatch("a/b/c", "a/b", 0));

    /* Null string and non-empty pattern returns false. */
	assertEqualInt(0, archive_pathmatch("a/b/c", NULL, 0));
	assertEqualInt(0, archive_pathmatch_w(L"a/b/c", NULL, 0));

	/* Empty pattern only matches empty string. */
	assertEqualInt(1, archive_pathmatch("","", 0));
	assertEqualInt(0, archive_pathmatch("","a", 0));
	assertEqualInt(1, archive_pathmatch("*","", 0));
	assertEqualInt(1, archive_pathmatch("*","a", 0));
	assertEqualInt(1, archive_pathmatch("*","abcd", 0));
	/* SUSv2: * matches / */
	assertEqualInt(1, archive_pathmatch("*","abcd/efgh/ijkl", 0));
	assertEqualInt(1, archive_pathmatch("abcd*efgh/ijkl","abcd/efgh/ijkl", 0));
	assertEqualInt(1, archive_pathmatch("abcd***efgh/ijkl","abcd/efgh/ijkl", 0));
	assertEqualInt(1, archive_pathmatch("abcd***/efgh/ijkl","abcd/efgh/ijkl", 0));
	assertEqualInt(0, archive_pathmatch("?", "", 0));
	assertEqualInt(0, archive_pathmatch("?", "\0", 0));
	assertEqualInt(1, archive_pathmatch("?", "a", 0));
	assertEqualInt(0, archive_pathmatch("?", "ab", 0));
	assertEqualInt(1, archive_pathmatch("?", ".", 0));
	assertEqualInt(1, archive_pathmatch("?", "?", 0));
	assertEqualInt(1, archive_pathmatch("a", "a", 0));
	assertEqualInt(0, archive_pathmatch("a", "ab", 0));
	assertEqualInt(0, archive_pathmatch("a", "ab", 0));
	assertEqualInt(1, archive_pathmatch("a?c", "abc", 0));
	/* SUSv2: ? matches / */
	assertEqualInt(1, archive_pathmatch("a?c", "a/c", 0));
	assertEqualInt(1, archive_pathmatch("a?*c*", "a/c", 0));
	assertEqualInt(1, archive_pathmatch("*a*", "a/c", 0));
	assertEqualInt(1, archive_pathmatch("*a*", "/a/c", 0));
	assertEqualInt(1, archive_pathmatch("*a*", "defaaaaaaa", 0));
	assertEqualInt(0, archive_pathmatch("a*", "defghi", 0));
	assertEqualInt(0, archive_pathmatch("*a*", "defghi", 0));

	/* Character classes */
	assertEqualInt(1, archive_pathmatch("abc[def", "abc[def", 0));
	assertEqualInt(0, archive_pathmatch("abc[def]", "abc[def", 0));
	assertEqualInt(0, archive_pathmatch("abc[def", "abcd", 0));
	assertEqualInt(1, archive_pathmatch("abc[def]", "abcd", 0));
	assertEqualInt(1, archive_pathmatch("abc[def]", "abce", 0));
	assertEqualInt(1, archive_pathmatch("abc[def]", "abcf", 0));
	assertEqualInt(0, archive_pathmatch("abc[def]", "abcg", 0));
	assertEqualInt(1, archive_pathmatch("abc[d*f]", "abcd", 0));
	assertEqualInt(1, archive_pathmatch("abc[d*f]", "abc*", 0));
	assertEqualInt(0, archive_pathmatch("abc[d*f]", "abcdefghi", 0));
	assertEqualInt(0, archive_pathmatch("abc[d*", "abcdefghi", 0));
	assertEqualInt(1, archive_pathmatch("abc[d*", "abc[defghi", 0));
	assertEqualInt(1, archive_pathmatch("abc[d-f]", "abcd", 0));
	assertEqualInt(1, archive_pathmatch("abc[d-f]", "abce", 0));
	assertEqualInt(1, archive_pathmatch("abc[d-f]", "abcf", 0));
	assertEqualInt(0, archive_pathmatch("abc[d-f]", "abcg", 0));
	assertEqualInt(0, archive_pathmatch("abc[d-fh-k]", "abca", 0));
	assertEqualInt(1, archive_pathmatch("abc[d-fh-k]", "abcd", 0));
	assertEqualInt(1, archive_pathmatch("abc[d-fh-k]", "abce", 0));
	assertEqualInt(1, archive_pathmatch("abc[d-fh-k]", "abcf", 0));
	assertEqualInt(0, archive_pathmatch("abc[d-fh-k]", "abcg", 0));
	assertEqualInt(1, archive_pathmatch("abc[d-fh-k]", "abch", 0));
	assertEqualInt(1, archive_pathmatch("abc[d-fh-k]", "abci", 0));
	assertEqualInt(1, archive_pathmatch("abc[d-fh-k]", "abcj", 0));
	assertEqualInt(1, archive_pathmatch("abc[d-fh-k]", "abck", 0));
	assertEqualInt(0, archive_pathmatch("abc[d-fh-k]", "abcl", 0));
	assertEqualInt(0, archive_pathmatch("abc[d-fh-k]", "abc-", 0));

	/* [] matches nothing, [!] is the same as ? */
	assertEqualInt(0, archive_pathmatch("abc[]efg", "abcdefg", 0));
	assertEqualInt(0, archive_pathmatch("abc[]efg", "abcqefg", 0));
	assertEqualInt(0, archive_pathmatch("abc[]efg", "abcefg", 0));
	assertEqualInt(1, archive_pathmatch("abc[!]efg", "abcdefg", 0));
	assertEqualInt(1, archive_pathmatch("abc[!]efg", "abcqefg", 0));
	assertEqualInt(0, archive_pathmatch("abc[!]efg", "abcefg", 0));

	/* I assume: Trailing '-' is non-special. */
	assertEqualInt(0, archive_pathmatch("abc[d-fh-]", "abcl", 0));
	assertEqualInt(1, archive_pathmatch("abc[d-fh-]", "abch", 0));
	assertEqualInt(1, archive_pathmatch("abc[d-fh-]", "abc-", 0));
	assertEqualInt(1, archive_pathmatch("abc[d-fh-]", "abc-", 0));

	/* ']' can be backslash-quoted within a character class. */
	assertEqualInt(1, archive_pathmatch("abc[\\]]", "abc]", 0));
	assertEqualInt(1, archive_pathmatch("abc[\\]d]", "abc]", 0));
	assertEqualInt(1, archive_pathmatch("abc[\\]d]", "abcd", 0));
	assertEqualInt(1, archive_pathmatch("abc[d\\]]", "abc]", 0));
	assertEqualInt(1, archive_pathmatch("abc[d\\]]", "abcd", 0));
	assertEqualInt(1, archive_pathmatch("abc[d]e]", "abcde]", 0));
	assertEqualInt(1, archive_pathmatch("abc[d\\]e]", "abc]", 0));
	assertEqualInt(0, archive_pathmatch("abc[d\\]e]", "abcd]e", 0));
	assertEqualInt(0, archive_pathmatch("abc[d]e]", "abc]", 0));

	/* backslash-quoted chars can appear as either end of a range. */
	assertEqualInt(1, archive_pathmatch("abc[\\d-f]gh", "abcegh", 0));
	assertEqualInt(0, archive_pathmatch("abc[\\d-f]gh", "abcggh", 0));
	assertEqualInt(0, archive_pathmatch("abc[\\d-f]gh", "abc\\gh", 0));
	assertEqualInt(1, archive_pathmatch("abc[d-\\f]gh", "abcegh", 0));
	assertEqualInt(1, archive_pathmatch("abc[\\d-\\f]gh", "abcegh", 0));
	assertEqualInt(1, archive_pathmatch("abc[\\d-\\f]gh", "abcegh", 0));
	/* backslash-quoted '-' isn't special. */
	assertEqualInt(0, archive_pathmatch("abc[d\\-f]gh", "abcegh", 0));
	assertEqualInt(1, archive_pathmatch("abc[d\\-f]gh", "abc-gh", 0));

	/* Leading '!' negates a character class. */
	assertEqualInt(0, archive_pathmatch("abc[!d]", "abcd", 0));
	assertEqualInt(1, archive_pathmatch("abc[!d]", "abce", 0));
	assertEqualInt(1, archive_pathmatch("abc[!d]", "abcc", 0));
	assertEqualInt(0, archive_pathmatch("abc[!d-z]", "abcq", 0));
	assertEqualInt(1, archive_pathmatch("abc[!d-gi-z]", "abch", 0));
	assertEqualInt(1, archive_pathmatch("abc[!fgijkl]", "abch", 0));
	assertEqualInt(0, archive_pathmatch("abc[!fghijkl]", "abch", 0));

	/* Backslash quotes next character. */
	assertEqualInt(0, archive_pathmatch("abc\\[def]", "abc\\d", 0));
	assertEqualInt(1, archive_pathmatch("abc\\[def]", "abc[def]", 0));
	assertEqualInt(0, archive_pathmatch("abc\\\\[def]", "abc[def]", 0));
	assertEqualInt(0, archive_pathmatch("abc\\\\[def]", "abc\\[def]", 0));
	assertEqualInt(1, archive_pathmatch("abc\\\\[def]", "abc\\d", 0));
	assertEqualInt(1, archive_pathmatch("abcd\\", "abcd\\", 0));
	assertEqualInt(0, archive_pathmatch("abcd\\", "abcd\\[", 0));
	assertEqualInt(0, archive_pathmatch("abcd\\", "abcde", 0));
	assertEqualInt(0, archive_pathmatch("abcd\\[", "abcd\\", 0));

	/*
	 * Because '.' and '/' have special meanings, we can
	 * identify many equivalent paths even if they're expressed
	 * differently.  (But quoting a character with '\\' suppresses
	 * special meanings!)
	 */
	assertEqualInt(0, archive_pathmatch("a/b/", "a/bc", 0));
	assertEqualInt(1, archive_pathmatch("a/./b", "a/b", 0));
	assertEqualInt(0, archive_pathmatch("a\\/./b", "a/b", 0));
	assertEqualInt(0, archive_pathmatch("a/\\./b", "a/b", 0));
	assertEqualInt(0, archive_pathmatch("a/.\\/b", "a/b", 0));
	assertEqualInt(0, archive_pathmatch("a\\/\\.\\/b", "a/b", 0));
	assertEqualInt(1, archive_pathmatch("./abc/./def/", "abc/def/", 0));
	assertEqualInt(1, archive_pathmatch("abc/def", "./././abc/./def", 0));
	assertEqualInt(1, archive_pathmatch("abc/def/././//", "./././abc/./def/", 0));
	assertEqualInt(1, archive_pathmatch(".////abc/.//def", "./././abc/./def", 0));
	assertEqualInt(1, archive_pathmatch("./abc?def/", "abc/def/", 0));
	failure("\"?./\" is not the same as \"/./\"");
	assertEqualInt(0, archive_pathmatch("./abc?./def/", "abc/def/", 0));
	failure("Trailing '/' should match no trailing '/'");
	assertEqualInt(1, archive_pathmatch("./abc/./def/", "abc/def", 0));
	failure("Trailing '/./' is still the same directory.");
	assertEqualInt(1, archive_pathmatch("./abc/./def/./", "abc/def", 0));
	failure("Trailing '/.' is still the same directory.");
	assertEqualInt(1, archive_pathmatch("./abc/./def/.", "abc/def", 0));
	assertEqualInt(1, archive_pathmatch("./abc/./def", "abc/def/", 0));
	failure("Trailing '/./' is still the same directory.");
	assertEqualInt(1, archive_pathmatch("./abc/./def", "abc/def/./", 0));
	failure("Trailing '/.' is still the same directory.");
	assertEqualInt(1, archive_pathmatch("./abc*/./def", "abc/def/.", 0));

	/* Matches not anchored at beginning. */
	assertEqualInt(0,
	    archive_pathmatch("bcd", "abcd", PATHMATCH_NO_ANCHOR_START));
	assertEqualInt(1,
	    archive_pathmatch("abcd", "abcd", PATHMATCH_NO_ANCHOR_START));
	assertEqualInt(0,
	    archive_pathmatch("^bcd", "abcd", PATHMATCH_NO_ANCHOR_START));
	assertEqualInt(1,
	    archive_pathmatch("b/c/d", "a/b/c/d", PATHMATCH_NO_ANCHOR_START));
	assertEqualInt(0,
	    archive_pathmatch("^b/c/d", "a/b/c/d", PATHMATCH_NO_ANCHOR_START));
	assertEqualInt(0,
	    archive_pathmatch("/b/c/d", "a/b/c/d", PATHMATCH_NO_ANCHOR_START));
	assertEqualInt(0,
	    archive_pathmatch("a/b/c", "a/b/c/d", PATHMATCH_NO_ANCHOR_START));
	assertEqualInt(1,
	    archive_pathmatch("a/b/c/d", "a/b/c/d", PATHMATCH_NO_ANCHOR_START));
	assertEqualInt(0,
	    archive_pathmatch("b/c", "a/b/c/d", PATHMATCH_NO_ANCHOR_START));
	assertEqualInt(0,
	    archive_pathmatch("^b/c", "a/b/c/d", PATHMATCH_NO_ANCHOR_START));


	assertEqualInt(1,
	    archive_pathmatch("b/c/d", "a/b/c/d", PATHMATCH_NO_ANCHOR_START));
	assertEqualInt(1,
	    archive_pathmatch("b/c/d", "/a/b/c/d", PATHMATCH_NO_ANCHOR_START));


	/* Matches not anchored at end. */
	assertEqualInt(0,
	    archive_pathmatch("bcd", "abcd", PATHMATCH_NO_ANCHOR_END));
	assertEqualInt(1,
	    archive_pathmatch("abcd", "abcd", PATHMATCH_NO_ANCHOR_END));
	assertEqualInt(1,
	    archive_pathmatch("abcd", "abcd/", PATHMATCH_NO_ANCHOR_END));
	assertEqualInt(1,
	    archive_pathmatch("abcd", "abcd/.", PATHMATCH_NO_ANCHOR_END));
	assertEqualInt(0,
	    archive_pathmatch("abc", "abcd", PATHMATCH_NO_ANCHOR_END));
	assertEqualInt(1,
	    archive_pathmatch("a/b/c", "a/b/c/d", PATHMATCH_NO_ANCHOR_END));
	assertEqualInt(0,
	    archive_pathmatch("a/b/c$", "a/b/c/d", PATHMATCH_NO_ANCHOR_END));
	assertEqualInt(1,
	    archive_pathmatch("a/b/c$", "a/b/c", PATHMATCH_NO_ANCHOR_END));
	assertEqualInt(1,
	    archive_pathmatch("a/b/c$", "a/b/c/", PATHMATCH_NO_ANCHOR_END));
	assertEqualInt(1,
	    archive_pathmatch("a/b/c/", "a/b/c/d", PATHMATCH_NO_ANCHOR_END));
	assertEqualInt(0,
	    archive_pathmatch("a/b/c/$", "a/b/c/d", PATHMATCH_NO_ANCHOR_END));
	assertEqualInt(1,
	    archive_pathmatch("a/b/c/$", "a/b/c/", PATHMATCH_NO_ANCHOR_END));
	assertEqualInt(1,
	    archive_pathmatch("a/b/c/$", "a/b/c", PATHMATCH_NO_ANCHOR_END));
	assertEqualInt(0,
	    archive_pathmatch("b/c", "a/b/c/d", PATHMATCH_NO_ANCHOR_END));

	/* Matches not anchored at either end. */
	assertEqualInt(1,
	    archive_pathmatch("b/c", "a/b/c/d", PATHMATCH_NO_ANCHOR_START | PATHMATCH_NO_ANCHOR_END));
	assertEqualInt(0,
	    archive_pathmatch("/b/c", "a/b/c/d", PATHMATCH_NO_ANCHOR_START | PATHMATCH_NO_ANCHOR_END));
	assertEqualInt(0,
	    archive_pathmatch("/a/b/c", "a/b/c/d", PATHMATCH_NO_ANCHOR_START | PATHMATCH_NO_ANCHOR_END));
	assertEqualInt(1,
	    archive_pathmatch("/a/b/c", "/a/b/c/d", PATHMATCH_NO_ANCHOR_START | PATHMATCH_NO_ANCHOR_END));
	assertEqualInt(0,
	    archive_pathmatch("/a/b/c$", "a/b/c/d", PATHMATCH_NO_ANCHOR_START | PATHMATCH_NO_ANCHOR_END));
	assertEqualInt(0,
	    archive_pathmatch("/a/b/c/d$", "a/b/c/d", PATHMATCH_NO_ANCHOR_START | PATHMATCH_NO_ANCHOR_END));
	assertEqualInt(0,
	    archive_pathmatch("/a/b/c/d$", "/a/b/c/d/e", PATHMATCH_NO_ANCHOR_START | PATHMATCH_NO_ANCHOR_END));
	assertEqualInt(1,
	    archive_pathmatch("/a/b/c/d$", "/a/b/c/d", PATHMATCH_NO_ANCHOR_START | PATHMATCH_NO_ANCHOR_END));
	assertEqualInt(1,
	    archive_pathmatch("^a/b/c", "a/b/c/d", PATHMATCH_NO_ANCHOR_START | PATHMATCH_NO_ANCHOR_END));
	assertEqualInt(0,
	    archive_pathmatch("^a/b/c$", "a/b/c/d", PATHMATCH_NO_ANCHOR_START | PATHMATCH_NO_ANCHOR_END));
	assertEqualInt(0,
	    archive_pathmatch("a/b/c$", "a/b/c/d", PATHMATCH_NO_ANCHOR_START | PATHMATCH_NO_ANCHOR_END));
	assertEqualInt(1,
	    archive_pathmatch("b/c/d$", "a/b/c/d", PATHMATCH_NO_ANCHOR_START | PATHMATCH_NO_ANCHOR_END));
}